

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::
SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
::SharedPtr(SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
            *this,Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *ptr)

{
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *pDVar1;
  SharedPtrState<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>
  *pSVar2;
  DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  local_25 [13];
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *local_18;
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *ptr_local;
  SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  *this_local;
  
  this->m_ptr = (Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)this;
  pSVar2 = (SharedPtrState<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>
            *)operator_new(0x20);
  pDVar1 = local_18;
  DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  ::DefaultDeleter(local_25);
  SharedPtrState<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>
  ::SharedPtrState(pSVar2,pDVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}